

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

ns_connection * ns_connect(ns_mgr *mgr,char *address,ns_callback_t callback,void *user_data)

{
  int sock_00;
  int iVar1;
  uint uVar2;
  int local_138;
  int local_134;
  int local_130;
  int proto;
  int use_ssl;
  int rc;
  char ca_cert [100];
  char local_b8 [8];
  char cert [100];
  socket_address sa;
  ns_connection *nc;
  sock_t sock;
  void *user_data_local;
  ns_callback_t callback_local;
  char *address_local;
  ns_mgr *mgr_local;
  
  ns_parse_address(address,(socket_address *)(cert + 0x60),&local_134,&local_130,local_b8,
                   (char *)&use_ssl);
  sock_00 = socket(2,local_134,0);
  if (sock_00 == -1) {
    mgr_local = (ns_mgr *)0x0;
  }
  else {
    ns_set_non_blocking_mode(sock_00);
    if (local_134 == 2) {
      local_138 = 0;
    }
    else {
      local_138 = connect(sock_00,(sockaddr *)(cert + 0x60),0x10);
    }
    proto = local_138;
    if ((local_138 != 0) && (iVar1 = ns_is_error(local_138), iVar1 != 0)) {
      close(sock_00);
      return (ns_connection *)0x0;
    }
    mgr_local = (ns_mgr *)ns_add_sock(mgr,sock_00,callback,user_data);
    if ((ns_connection *)mgr_local == (ns_connection *)0x0) {
      close(sock_00);
      mgr_local = (ns_mgr *)0x0;
    }
    else {
      *(undefined8 *)&((ns_connection *)mgr_local)->sa = stack0xffffffffffffffb0;
      *(undefined8 *)((long)&((ns_connection *)mgr_local)->sa + 8) = sa._0_8_;
      uVar2 = 8;
      if (local_134 == 2) {
        uVar2 = 0x100;
      }
      ((ns_connection *)mgr_local)->flags = uVar2;
    }
  }
  return (ns_connection *)mgr_local;
}

Assistant:

struct ns_connection *ns_connect(struct ns_mgr *mgr, const char *address,
                                 ns_callback_t callback, void *user_data) {
  sock_t sock = INVALID_SOCKET;
  struct ns_connection *nc = NULL;
  union socket_address sa;
  char cert[100], ca_cert[100];
  int rc, use_ssl, proto;

  ns_parse_address(address, &sa, &proto, &use_ssl, cert, ca_cert);
  if ((sock = socket(AF_INET, proto, 0)) == INVALID_SOCKET) {
    return NULL;
  }
  ns_set_non_blocking_mode(sock);
  rc = (proto == SOCK_DGRAM) ? 0 : connect(sock, &sa.sa, sizeof(sa.sin));

  if (rc != 0 && ns_is_error(rc)) {
    closesocket(sock);
    return NULL;
  } else if ((nc = ns_add_sock(mgr, sock, callback, user_data)) == NULL) {
    closesocket(sock);
    return NULL;
  }

  nc->sa = sa;   // Important, cause UDP conns will use sendto()
  nc->flags = (proto == SOCK_DGRAM) ? NSF_UDP : NSF_CONNECTING;

#ifdef NS_ENABLE_SSL
  if (use_ssl) {
    if ((nc->ssl_ctx = SSL_CTX_new(SSLv23_client_method())) == NULL ||
        ns_use_cert(nc->ssl_ctx, cert) != 0 ||
        ns_use_ca_cert(nc->ssl_ctx, ca_cert) != 0 ||
        (nc->ssl = SSL_new(nc->ssl_ctx)) == NULL) {
      ns_close_conn(nc);
      return NULL;
    } else {
      SSL_set_fd(nc->ssl, sock);
    }
  }
#endif

  return nc;
}